

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_callmeta(lua_State *L,int idx,char *field)

{
  TValue *pTVar1;
  int iVar2;
  TValue *pTVar3;
  undefined8 in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *base;
  char *in_stack_ffffffffffffffc0;
  TValue *pTVar4;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_1c;
  
  iVar2 = luaL_getmetafield((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                            (int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffc0);
  if (iVar2 != 0) {
    pTVar1 = in_RDI->top;
    in_RDI->top = pTVar1 + -1;
    pTVar4 = pTVar1;
    pTVar3 = index2adr(in_RDI,in_ESI);
    *pTVar1 = *pTVar3;
    in_RDI->top = pTVar4 + 1;
    lj_vm_call(in_RDI,pTVar4,2);
  }
  local_1c = (uint)(iVar2 != 0);
  return local_1c;
}

Assistant:

LUALIB_API int luaL_callmeta(lua_State *L, int idx, const char *field)
{
  if (luaL_getmetafield(L, idx, field)) {
    TValue *base = L->top--;
    copyTV(L, base, index2adr(L, idx));
    L->top = base+1;
    lj_vm_call(L, base, 1+1);
    return 1;
  }
  return 0;
}